

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

Snapshot * __thiscall cmState::Reset(Snapshot *__return_storage_ptr__,cmState *this)

{
  cmLinkedTree<cmDefinitions> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  pointer pSVar6;
  pointer puVar7;
  pointer pPVar8;
  cmLinkedTree<cmState::PolicyStackEntry> *pcVar9;
  StackIter begin;
  StackIter end;
  StackIter begin_00;
  StackIter end_00;
  PointerType pBVar10;
  PointerType pSVar11;
  char *pcVar12;
  PointerType pcVar13;
  mapped_type *pmVar14;
  pointer pcVar15;
  iterator iVar16;
  iterator it;
  PositionType pos;
  string binDir;
  undefined1 local_b0 [39];
  allocator local_89;
  iterator local_88;
  string local_78;
  string local_58;
  Snapshot *local_38;
  
  local_38 = __return_storage_ptr__;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           *)&this->GlobalProperties);
  std::
  _Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
  ::clear((_Rb_tree<cmProperty::ScopeType,_std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>,_std::_Select1st<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
           *)this);
  local_88 = cmLinkedTree<cmState::SnapshotDataType>::Truncate(&this->SnapshotData);
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Truncate(&this->ExecutionListFiles);
  local_b0._0_16_ =
       (undefined1  [16])
       cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Truncate(&this->BuildsystemDirectory);
  pBVar10 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar10->IncludeDirectories,
                    (pBVar10->IncludeDirectories).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar10 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  pcVar4 = (pBVar10->IncludeDirectoryBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (pBVar10->IncludeDirectoryBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar15 = pcVar4;
  if (pcVar5 != pcVar4) {
    do {
      cmListFileBacktrace::~cmListFileBacktrace(pcVar15);
      pcVar15 = pcVar15 + 1;
    } while (pcVar15 != pcVar5);
    (pBVar10->IncludeDirectoryBacktraces).
    super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar4;
  }
  pBVar10 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar10->CompileDefinitions,
                    (pBVar10->CompileDefinitions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar10 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  pcVar4 = (pBVar10->CompileDefinitionsBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (pBVar10->CompileDefinitionsBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar15 = pcVar4;
  if (pcVar5 != pcVar4) {
    do {
      cmListFileBacktrace::~cmListFileBacktrace(pcVar15);
      pcVar15 = pcVar15 + 1;
    } while (pcVar15 != pcVar5);
    (pBVar10->CompileDefinitionsBacktraces).
    super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar4;
  }
  pBVar10 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&pBVar10->CompileOptions,
                    (pBVar10->CompileOptions).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  pBVar10 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  pcVar4 = (pBVar10->CompileOptionsBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (pBVar10->CompileOptionsBacktraces).
           super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pcVar15 = pcVar4;
  if (pcVar5 != pcVar4) {
    do {
      cmListFileBacktrace::~cmListFileBacktrace(pcVar15);
      pcVar15 = pcVar15 + 1;
    } while (pcVar15 != pcVar5);
    (pBVar10->CompileOptionsBacktraces).
    super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar4;
  }
  pBVar10 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  (pBVar10->DirectoryEnd).Tree = local_88.Tree;
  (pBVar10->DirectoryEnd).Position = local_88.Position;
  pBVar10 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
           *)&pBVar10->Properties);
  pBVar10 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                      ((iterator *)local_b0);
  pSVar6 = (pBVar10->Children).
           super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pBVar10->Children).super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar6) {
    (pBVar10->Children).super__Vector_base<cmState::Snapshot,_std::allocator<cmState::Snapshot>_>.
    _M_impl.super__Vector_impl_data._M_finish = pSVar6;
  }
  puVar7 = (this->PolicyStack).UpPositions.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->PolicyStack).UpPositions.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar7) {
    (this->PolicyStack).UpPositions.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar7;
  }
  pcVar9 = &this->PolicyStack;
  pPVar8 = (this->PolicyStack).Data.
           super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->PolicyStack).Data.
      super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish != pPVar8) {
    (this->PolicyStack).Data.
    super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>.
    _M_impl.super__Vector_impl_data._M_finish = pPVar8;
  }
  pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
  (pSVar11->Policies).Tree = pcVar9;
  (pSVar11->Policies).Position = 0;
  pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
  (pSVar11->PolicyRoot).Tree = pcVar9;
  (pSVar11->PolicyRoot).Position = 0;
  pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
  (pSVar11->PolicyScope).Tree = pcVar9;
  (pSVar11->PolicyScope).Position = 0;
  pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
  pcVar9 = (pSVar11->Policies).Tree;
  if ((pcVar9 != (cmLinkedTree<cmState::PolicyStackEntry> *)0x0) &&
     ((pSVar11->Policies).Position <=
      (ulong)(((long)(pcVar9->Data).
                     super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pcVar9->Data).
                     super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))) {
    pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
    pcVar9 = (pSVar11->PolicyRoot).Tree;
    if ((pcVar9 != (cmLinkedTree<cmState::PolicyStackEntry> *)0x0) &&
       ((pSVar11->PolicyRoot).Position <=
        (ulong)(((long)(pcVar9->Data).
                       super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pcVar9->Data).
                       super__Vector_base<cmState::PolicyStackEntry,_std::allocator<cmState::PolicyStackEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333))) {
      paVar1 = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CMAKE_SOURCE_DIR","");
      pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
      begin.Tree = (pSVar11->Vars).Tree;
      begin.Position = (pSVar11->Vars).Position;
      pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
      end.Tree = (pSVar11->Root).Tree;
      end.Position = (pSVar11->Root).Position;
      pcVar12 = cmDefinitions::Get(&local_78,begin,end);
      std::__cxx11::string::string((string *)local_b0,pcVar12,(allocator *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_BINARY_DIR","");
      pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
      begin_00.Tree = (pSVar11->Vars).Tree;
      begin_00.Position = (pSVar11->Vars).Position;
      pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
      end_00.Tree = (pSVar11->Root).Tree;
      end_00.Position = (pSVar11->Root).Position;
      pcVar12 = cmDefinitions::Get(&local_58,begin_00,end_00);
      std::__cxx11::string::string((string *)&local_78,pcVar12,&local_89);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      this_00 = &this->VarTree;
      cmLinkedTree<cmDefinitions>::Clear(this_00);
      iVar16.Position = 0;
      iVar16.Tree = this_00;
      iVar16 = cmLinkedTree<cmDefinitions>::Push(this_00,iVar16);
      pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
      pSVar11->Vars = iVar16;
      pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
      (pSVar11->Parent).Tree = this_00;
      (pSVar11->Parent).Position = 0;
      pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
      (pSVar11->Root).Tree = this_00;
      (pSVar11->Root).Position = 0;
      pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
      pcVar13 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar11->Vars);
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_SOURCE_DIR","");
      cmDefinitions::Set(pcVar13,&local_58,(char *)local_b0._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pSVar11 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_88);
      pcVar13 = cmLinkedTree<cmDefinitions>::iterator::operator->(&pSVar11->Vars);
      local_58._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CMAKE_BINARY_DIR","");
      cmDefinitions::Set(pcVar13,&local_58,local_78._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != paVar1) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pcVar3 = (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)(local_b0 + 0x10);
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_COMPILE","");
      local_78._M_dataplus._M_p._0_4_ = 2;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_LINK","");
      local_78._M_dataplus._M_p._0_4_ = 2;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_CUSTOM","");
      local_78._M_dataplus._M_p._0_4_ = 2;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_COMPILE","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_LINK","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"RULE_LAUNCH_CUSTOM","");
      local_78._M_dataplus._M_p = local_78._M_dataplus._M_p & 0xffffffff00000000;
      pmVar14 = std::
                map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                ::operator[](&this->PropertyDefinitions,(key_type *)&local_78);
      cmPropertyDefinitionMap::DefineProperty
                (pmVar14,(string *)local_b0,(ScopeType)local_78._M_dataplus._M_p,"","",true);
      if ((cmLinkedTree<cmState::BuildsystemDirectoryStateType> *)local_b0._0_8_ != pcVar3) {
        operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
      }
      local_38->State = this;
      (local_38->Position).Tree = local_88.Tree;
      (local_38->Position).Position = local_88.Position;
      return local_38;
    }
    __assert_fail("pos->PolicyRoot.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                  ,0x151,"cmState::Snapshot cmState::Reset()");
  }
  __assert_fail("pos->Policies.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmState.cxx"
                ,0x150,"cmState::Snapshot cmState::Reset()");
}

Assistant:

cmState::Snapshot cmState::Reset()
{
  this->GlobalProperties.clear();
  this->PropertyDefinitions.clear();

  PositionType pos = this->SnapshotData.Truncate();
  this->ExecutionListFiles.Truncate();

  {
  cmLinkedTree<BuildsystemDirectoryStateType>::iterator it =
      this->BuildsystemDirectory.Truncate();
  it->IncludeDirectories.clear();
  it->IncludeDirectoryBacktraces.clear();
  it->CompileDefinitions.clear();
  it->CompileDefinitionsBacktraces.clear();
  it->CompileOptions.clear();
  it->CompileOptionsBacktraces.clear();
  it->DirectoryEnd = pos;
  it->Properties.clear();
  it->Children.clear();
  }

  this->PolicyStack.Clear();
  pos->Policies = this->PolicyStack.Root();
  pos->PolicyRoot = this->PolicyStack.Root();
  pos->PolicyScope = this->PolicyStack.Root();
  assert(pos->Policies.IsValid());
  assert(pos->PolicyRoot.IsValid());

  {
  std::string srcDir =
      cmDefinitions::Get("CMAKE_SOURCE_DIR", pos->Vars, pos->Root);
  std::string binDir =
      cmDefinitions::Get("CMAKE_BINARY_DIR", pos->Vars, pos->Root);
  this->VarTree.Clear();
  pos->Vars = this->VarTree.Push(this->VarTree.Root());
  pos->Parent = this->VarTree.Root();
  pos->Root = this->VarTree.Root();

  pos->Vars->Set("CMAKE_SOURCE_DIR", srcDir.c_str());
  pos->Vars->Set("CMAKE_BINARY_DIR", binDir.c_str());
  }

  this->DefineProperty
    ("RULE_LAUNCH_COMPILE", cmProperty::DIRECTORY,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_LINK", cmProperty::DIRECTORY,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_CUSTOM", cmProperty::DIRECTORY,
     "", "", true);

  this->DefineProperty
    ("RULE_LAUNCH_COMPILE", cmProperty::TARGET,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_LINK", cmProperty::TARGET,
     "", "", true);
  this->DefineProperty
    ("RULE_LAUNCH_CUSTOM", cmProperty::TARGET,
     "", "", true);

  return Snapshot(this, pos);
}